

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O3

from_chars_result
absl::lts_20250127::from_chars
          (Nonnull<const_char_*> first,Nonnull<const_char_*> last,float *value,chars_format fmt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  ulong uVar13;
  anon_unknown_0 *paVar14;
  int iVar15;
  long lVar16;
  anon_unknown_0 *paVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  CalculatedFloat *calculated;
  byte bVar21;
  uint uVar22;
  Nonnull<bool_*> in_R9;
  int iVar23;
  Nonnull<const_char_*> begin;
  bool negative;
  float fVar24;
  CalculatedFloat CVar25;
  from_chars_result fVar26;
  uint128 value_00;
  from_chars_result result;
  ParsedFloat hex_parse;
  from_chars_result local_80;
  char local_69;
  ParsedFloat local_68;
  ulong local_38;
  
  local_80.ec = 0;
  negative = false;
  begin = first;
  if (first != last) {
    negative = *first == '-';
    begin = first + negative;
  }
  local_80.ptr = first;
  if (((fmt & hex) != 0) || ((long)last - (long)begin < 2)) {
    if ((fmt & hex) == 0) goto LAB_0049f795;
    strings_internal::ParseFloat<16>(&local_68,begin,last,fmt);
    if (local_68.end != (Nonnull<const_char_*>)0x0) goto LAB_0049f819;
LAB_0049f856:
    local_80.ec = invalid_argument;
    goto LAB_0049fba9;
  }
  if ((*begin == '0') && ((byte)(begin[1] | 0x20U) == 0x78)) {
    strings_internal::ParseFloat<16>(&local_68,begin + 2,last,fmt);
    if ((local_68.end == (Nonnull<const_char_*>)0x0) || (local_68.type != kNumber)) {
      if (fmt != scientific) {
        local_80.ptr = begin + 1;
        if (negative == false) {
          fVar24 = 0.0;
        }
        else {
          fVar24 = -0.0;
        }
        *value = fVar24;
        goto LAB_0049fba9;
      }
      goto LAB_0049f856;
    }
LAB_0049f819:
    local_80.ptr = local_68.end;
    bVar12 = anon_unknown_0::HandleEdgeCase<float>(&local_68,negative,value);
    if (bVar12) goto LAB_0049fba9;
    CVar25 = anon_unknown_0::CalculateFromParsedHexadecimal<float>
                       ((anon_unknown_0 *)local_68.mantissa,
                        (ParsedFloat *)(ulong)(uint)local_68.exponent);
    calculated = (CalculatedFloat *)(ulong)(uint)CVar25.exponent;
    paVar14 = (anon_unknown_0 *)CVar25.mantissa;
  }
  else {
LAB_0049f795:
    strings_internal::ParseFloat<10>(&local_68,begin,last,fmt);
    if (local_68.end == (Nonnull<const_char_*>)0x0) goto LAB_0049f856;
    local_80.ptr = local_68.end;
    bVar12 = anon_unknown_0::HandleEdgeCase<float>(&local_68,negative,value);
    if (bVar12) goto LAB_0049fba9;
    if (local_68.subrange_begin == (char *)0x0) {
      if (local_68.exponent < -0x40) {
        if (negative == false) {
          fVar24 = 0.0;
        }
        else {
          fVar24 = -0.0;
        }
      }
      else {
        if (local_68.exponent < 0x27) {
          if ((anon_unknown_0 *)local_68.mantissa == (anon_unknown_0 *)0x0) {
            local_38 = 0x40;
          }
          else {
            local_38 = 0x3f;
            if ((anon_unknown_0 *)local_68.mantissa != (anon_unknown_0 *)0x0) {
              for (; local_68.mantissa >> local_38 == 0; local_38 = local_38 - 1) {
              }
            }
            local_38 = local_38 ^ 0x3f;
          }
          in_R9 = (Nonnull<bool_*>)(local_68.mantissa << ((byte)local_38 & 0x3f));
          uVar13 = (ulong)(local_68.exponent + 0x156);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = in_R9;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable + uVar13 * 8);
          auVar2 = auVar2 * auVar5;
          iVar23 = local_68.exponent * 0x3526a >> 0x10;
          if (CARRY8(auVar2._0_8_,(ulong)in_R9) && (~auVar2._8_8_ & 0x3fffffffff) == 0) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = in_R9;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaLowTable + uVar13 * 8);
            uVar18 = SUB168(auVar3 * auVar6,8);
            auVar11._8_8_ = 0;
            auVar11._0_8_ = uVar18;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = uVar18;
            auVar11 = auVar2 + auVar11;
            uVar18 = auVar11._8_8_;
            auVar2 = auVar2 + auVar10;
            if (auVar11._0_8_ != -1 || (~uVar18 & 0x3fffffffff) != 0) goto LAB_0049fa34;
            if (CARRY8(SUB168(auVar3 * auVar6,0),(ulong)in_R9)) goto LAB_0049f8c7;
            uVar19 = uVar18 >> 0x3f;
            in_R9 = (Nonnull<bool_*>)(uVar18 >> (0x26U - (auVar11[0xf] >> 7) & 0x3f));
          }
          else {
LAB_0049fa34:
            uVar19 = auVar2._8_8_ >> 0x3f;
            in_R9 = (Nonnull<bool_*>)(auVar2._8_8_ >> (0x26U - (auVar2[0xf] >> 7) & 0x3f));
            if ((auVar2._0_8_ == 0) &&
               (((uint)in_R9 & 3) == 1 &&
                (auVar2 & (undefined1  [16])0x3fffffffff) == (undefined1  [16])0x0))
            goto LAB_0049f8c7;
          }
          lVar16 = (((long)((iVar23 - (int)local_38) + 0xbf) - (uVar19 ^ 1)) + 1) -
                   (ulong)(in_R9 + ((uint)in_R9 & 1) < (Nonnull<bool_*>)0x2000000);
          if (0xffffffffffffff01 < lVar16 - 0xffU) {
            uVar22 = (int)lVar16 * 0x800000;
            uVar20 = (uint)((ulong)(in_R9 + ((uint)in_R9 & 1)) >> 1) & 0x7fffff;
            fVar24 = (float)(uVar20 + uVar22 + 0x80000000);
            if (negative == false) {
              fVar24 = (float)(uVar22 | uVar20);
            }
            *value = fVar24;
            goto LAB_0049fba9;
          }
          goto LAB_0049f8c7;
        }
        if (negative == false) {
          fVar24 = 3.4028235e+38;
        }
        else {
          fVar24 = -3.4028235e+38;
        }
      }
      *value = fVar24;
      local_80.ec = result_out_of_range;
      goto LAB_0049fba9;
    }
    if (local_68.exponent < -0x156) {
      calculated = (CalculatedFloat *)0xfffe7961;
    }
    else {
      if (local_68.exponent < 0x135) {
        uVar13 = (ulong)(local_68.exponent + 0x156);
        iVar23 = local_68.exponent * 0x3526a >> 0x10;
LAB_0049f8c7:
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_68.mantissa;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)((anonymous_namespace)::kPower10MantissaHighTable + uVar13 * 8);
        auVar7 = auVar1 * auVar4;
        uVar18 = auVar7._8_8_;
        uVar13 = auVar7._0_8_;
        iVar23 = iVar23 + -0x3f;
        lVar16 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar16 == 0; lVar16 = lVar16 + -1) {
          }
        }
        uVar20 = (uint)lVar16 ^ 0x3f;
        if (local_68.subrange_begin == (char *)0x0) {
          if (uVar13 == 0) {
            uVar22 = 0x40;
          }
          else {
            lVar16 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar22 = (uint)lVar16 ^ 0x3f;
          }
          if (uVar18 == 0) {
            uVar20 = uVar22;
          }
          if ((uint)local_68.exponent < 0x1c) {
            iVar15 = ((uint)(uVar18 != 0) << 6 | 0x28) - uVar20;
            bVar21 = 1;
          }
          else {
            uVar20 = ((uint)(uVar18 != 0) * 0x40 + 1) - uVar20;
            bVar8 = (byte)uVar20 & 0x3f;
            uVar19 = uVar18 >> ((byte)uVar20 & 0x3f);
            bVar21 = 0;
            bVar12 = (uVar20 & 0x40) != 0;
            uVar13 = uVar13 >> bVar8 | uVar18 << 0x40 - bVar8;
            if (bVar12) {
              uVar13 = uVar19;
            }
            uVar18 = 0;
            if (!bVar12) {
              uVar18 = uVar19;
            }
            auVar7._8_8_ = uVar18;
            auVar7._0_8_ = uVar13;
            iVar23 = iVar23 + uVar20;
            iVar15 = 0x27;
          }
        }
        else {
          if (uVar13 == 0) {
            uVar22 = 0x40;
          }
          else {
            lVar16 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar16 == 0; lVar16 = lVar16 + -1) {
              }
            }
            uVar22 = (uint)lVar16 ^ 0x3f;
          }
          if (uVar18 == 0) {
            uVar20 = uVar22;
          }
          uVar20 = ((uint)(uVar18 != 0) << 6 | 6) - uVar20;
          bVar8 = (byte)uVar20 & 0x3f;
          uVar19 = uVar18 >> ((byte)uVar20 & 0x3f);
          bVar21 = 0;
          bVar12 = (uVar20 & 0x40) != 0;
          uVar13 = uVar13 >> bVar8 | uVar18 << 0x40 - bVar8;
          if (bVar12) {
            uVar13 = uVar19;
          }
          uVar18 = 0;
          if (!bVar12) {
            uVar18 = uVar19;
          }
          auVar7._8_8_ = uVar18;
          auVar7._0_8_ = uVar13;
          iVar23 = iVar23 + uVar20;
          iVar15 = 0x22;
        }
        value_00.lo_ = auVar7._8_8_;
        iVar9 = -0x95 - iVar23;
        if (-0x95 - iVar23 < iVar15) {
          iVar9 = iVar15;
        }
        value_00.hi_._0_4_ = iVar9;
        value_00.hi_._4_4_ = 0;
        paVar14 = (anon_unknown_0 *)
                  anon_unknown_0::ShiftRightAndRound
                            (auVar7._0_8_,value_00,(uint)bVar21,SUB81(&local_69,0),in_R9);
        if (local_69 == '\0') {
          bVar12 = anon_unknown_0::MustRoundUp((uint64_t)paVar14,iVar23 + iVar9,&local_68);
          paVar14 = paVar14 + bVar12;
        }
        paVar17 = (anon_unknown_0 *)&uleb128_00800000;
        if (paVar14 != (anon_unknown_0 *)0x1000000) {
          paVar17 = paVar14;
        }
        uVar22 = iVar23 + iVar9 + (uint)(paVar14 == (anon_unknown_0 *)0x1000000);
        uVar20 = 0xfffe7961;
        if (paVar17 != (anon_unknown_0 *)0x0) {
          uVar20 = uVar22;
        }
        calculated = (CalculatedFloat *)0x1869f;
        paVar14 = (anon_unknown_0 *)0x0;
        if ((int)uVar22 < 0x69) {
          calculated = (CalculatedFloat *)(ulong)uVar20;
          paVar14 = paVar17;
        }
        goto LAB_0049fb9f;
      }
      calculated = (CalculatedFloat *)0x1869f;
    }
    paVar14 = (anon_unknown_0 *)0x0;
  }
LAB_0049fb9f:
  anon_unknown_0::EncodeResult<float>(paVar14,calculated,negative,&local_80,value);
LAB_0049fba9:
  fVar26.ec = local_80.ec;
  fVar26.ptr = local_80.ptr;
  fVar26._12_4_ = 0;
  return fVar26;
}

Assistant:

from_chars_result from_chars(absl::Nonnull<const char*> first,
                             absl::Nonnull<const char*> last, float& value,
                             chars_format fmt) {
  return FromCharsImpl(first, last, value, fmt);
}